

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O0

void test_read_append_filter_wrong_program(void)

{
  anon_union_4_2_91654ee9_for___value __fd;
  wchar_t wVar1;
  int iVar2;
  FILE *pFVar3;
  archive *_a;
  undefined1 local_38 [8];
  fpos_t pos;
  int fd;
  FILE *fp;
  archive *a;
  archive_entry *ae;
  
  wVar1 = canRunCommand("bunzip2 -h");
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'Ö');
    test_skipping("Can\'t run bunzip2 program on this platform");
  }
  else {
    fflush(_stderr);
    fgetpos(_stderr,(fpos_t *)local_38);
    iVar2 = fileno(_stderr);
    pos.__state.__value.__wch = dup(iVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'Þ',(uint)(pos.__state.__value.__wch != 0xffffffff),
                     "(fd = dup(fileno(stderr))) != -1",(void *)0x0);
    pFVar3 = freopen("stderr1","w",_stderr);
    _a = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'â',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_read_set_format(_a,0x30000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'ã',(uint)(iVar2 == 0),"0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR)"
                     ,_a);
    iVar2 = archive_read_append_filter_program(_a,"bunzip2 -q");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'å',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_append_filter_program(a, \"bunzip2 -q\")",_a);
    iVar2 = archive_read_open_memory(_a,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'ç',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_open_memory(a, archive, sizeof(archive))",_a);
    iVar2 = archive_read_next_header(_a,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'è',(uint)(iVar2 < -0x14),
                     "archive_read_next_header(a, &ae) < (ARCHIVE_WARN)",_a);
    iVar2 = archive_read_close(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'é',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_read_close(a)",_a);
    iVar2 = archive_read_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'ê',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    if (pFVar3 != (FILE *)0x0) {
      fflush(_stderr);
      __fd = pos.__state.__value;
      iVar2 = fileno(_stderr);
      dup2(__fd.__wch,iVar2);
      clearerr(_stderr);
      fsetpos(_stderr,(fpos_t *)local_38);
    }
    close(pos.__state.__value.__wch);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_append_filter_wrong_program)
{
  struct archive_entry *ae;
  struct archive *a;
#if !defined(_WIN32) || defined(__CYGWIN__)
  FILE * fp;
  int fd;
  fpos_t pos;
#endif

  /*
   * If we have "bunzip2 -q", try using that.
   */
  if (!canRunCommand("bunzip2 -h")) {
    skipping("Can't run bunzip2 program on this platform");
    return;
  }

#if !defined(_WIN32) || defined(__CYGWIN__)
  /* bunzip2 will write to stderr, redirect it to a file */
  fflush(stderr);
  fgetpos(stderr, &pos);
  assert((fd = dup(fileno(stderr))) != -1);
  fp = freopen("stderr1", "w", stderr);
#endif

  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_append_filter_program(a, "bunzip2 -q"));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertA(archive_read_next_header(a, &ae) < (ARCHIVE_WARN));
  assertEqualIntA(a, ARCHIVE_WARN, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));

#if !defined(_WIN32) || defined(__CYGWIN__)
  /* restore stderr */
  if (fp != NULL) {
    fflush(stderr);
    dup2(fd, fileno(stderr));
    clearerr(stderr);
    (void)fsetpos(stderr, &pos);
  }
  close(fd);
#endif
}